

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  ushort uVar1;
  KeyValue *pKVar2;
  _Base_ptr p_Var3;
  Extension *pEVar4;
  KeyValue *pKVar5;
  _Rb_tree_header *p_Var6;
  difference_type __d;
  ulong uVar7;
  ulong uVar9;
  _Base_ptr p_Var10;
  ulong uVar8;
  
  if (0x100 < this->flat_capacity_) {
    p_Var6 = &(((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header;
    p_Var10 = (((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var6->_M_header;
    for (; p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < key])
    {
      if (key <= (int)p_Var10[1]._M_color) {
        p_Var3 = p_Var10;
      }
    }
    p_Var10 = &p_Var6->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var6) && (p_Var10 = p_Var3, key < (int)p_Var3[1]._M_color))
    {
      p_Var10 = &p_Var6->_M_header;
    }
    pEVar4 = (Extension *)0x0;
    if ((_Rb_tree_header *)p_Var10 != p_Var6) {
      pEVar4 = (Extension *)&p_Var10[1]._M_parent;
    }
    return pEVar4;
  }
  pKVar5 = (this->map_).flat;
  uVar1 = this->flat_size_;
  uVar8 = (ulong)uVar1;
  pKVar2 = pKVar5 + uVar1;
  if (uVar1 != 0) {
    do {
      uVar7 = uVar8 >> 1;
      uVar9 = uVar7;
      if (pKVar5[uVar7].first < key) {
        uVar9 = ~uVar7 + uVar8;
        pKVar5 = pKVar5 + uVar7 + 1;
      }
      uVar8 = uVar9;
    } while (0 < (long)uVar9);
  }
  if (pKVar5 != pKVar2) {
    pEVar4 = (Extension *)0x0;
    if (pKVar5->first == key) {
      pEVar4 = &pKVar5->second;
    }
    return pEVar4;
  }
  return (Extension *)0x0;
}

Assistant:

bool is_large() const { return flat_capacity_ > kMaximumFlatCapacity; }